

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O2

PmError alsa_poll(PmInternal *midi)

{
  long lVar1;
  int iVar2;
  snd_seq_event_t *in_RAX;
  long lVar3;
  long lVar4;
  snd_seq_event_t *ev;
  
  while( true ) {
    iVar2 = snd_seq_event_input_pending(seq,1);
    if (iVar2 < 1) break;
    while( true ) {
      iVar2 = snd_seq_event_input_pending(seq,0);
      if (iVar2 < 1) break;
      iVar2 = snd_seq_event_input(seq);
      if (iVar2 < 0) {
        if (iVar2 == -0x1c) {
          lVar4 = 0x30;
          iVar2 = pm_descriptor_index;
          for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
            if ((*(int *)((long)descriptors + lVar4 + -0x18) != 0) &&
               (lVar1 = *(long *)((long)&(descriptors->pub).structVersion + lVar4), lVar1 != 0)) {
              Pm_SetOverflow(*(PmQueue **)(lVar1 + 0x20));
              iVar2 = pm_descriptor_index;
            }
            lVar4 = lVar4 + 0x40;
          }
        }
      }
      else {
        handle_event(in_RAX);
      }
    }
  }
  return pmNoData;
}

Assistant:

static PmError alsa_poll(PmInternal *midi)
{
    snd_seq_event_t *ev;
    /* expensive check for input data, gets data from device: */
    while (snd_seq_event_input_pending(seq, TRUE) > 0) {
        /* cheap check on local input buffer */
        while (snd_seq_event_input_pending(seq, FALSE) > 0) {
            /* check for and ignore errors, e.g. input overflow */
            /* note: if there's overflow, this should be reported
             * all the way through to client. Since input from all
             * devices is merged, we need to find all input devices
             * and set all to the overflow state.
             * NOTE: this assumes every input is ALSA based.
             */
            int rslt = snd_seq_event_input(seq, &ev);
            if (rslt >= 0) {
                handle_event(ev);
            } else if (rslt == -ENOSPC) {
                int i;
                for (i = 0; i < pm_descriptor_index; i++) {
                    if (descriptors[i].pub.input) {
                        PmInternal *midi = (PmInternal *) 
                                descriptors[i].internalDescriptor;
                        /* careful, device may not be open! */
                        if (midi) Pm_SetOverflow(midi->queue);
                    }
                }
            }
        }
    }
    return pmNoError;
}